

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int fmt::v8::detail::parse_nonnegative_int<char32_t>(char32_t **begin,char32_t *end,int error_value)

{
  char32_t *pcVar1;
  int iVar2;
  char32_t *pcVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  pcVar3 = *begin;
  if ((pcVar3 == end) || (9 < (uint)(*pcVar3 + L'\xffffffd0'))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8ca,"");
  }
  uVar5 = 0;
  lVar4 = 4;
  do {
    lVar6 = lVar4;
    uVar7 = (ulong)uVar5;
    pcVar1 = (char32_t *)((long)pcVar3 + lVar6);
    iVar2 = *(int *)((long)pcVar3 + lVar6 + -4);
    uVar5 = (iVar2 + uVar5 * 10) - 0x30;
    if (pcVar1 == end) break;
    lVar4 = lVar6 + 4;
  } while ((uint)(*pcVar1 + L'\xffffffd0') < 10);
  *begin = pcVar1;
  if ((0x27 < lVar6) &&
     ((lVar6 != 0x28 || (((ulong)(iVar2 - 0x30) + uVar7 * 10 & 0xffffffff80000000) != 0)))) {
    uVar5 = error_value;
  }
  return uVar5;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}